

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tp_ssl.c
# Opt level: O0

int ssl_init(void)

{
  SSL_METHOD *meth;
  int local_c;
  
  OPENSSL_init_ssl(0);
  OPENSSL_init_ssl(random_char + 0xa65c2,0);
  meth = (SSL_METHOD *)TLS_client_method();
  ssl_ctx = (SSL_CTX *)SSL_CTX_new(meth);
  if ((SSL_CTX *)ssl_ctx == (SSL_CTX *)0x0) {
    local_c = -1;
  }
  else {
    SSL_CTX_ctrl((SSL_CTX *)ssl_ctx,0x7b,0x303,(void *)0x0);
    SSL_CTX_set_verify((SSL_CTX *)ssl_ctx,0,(callback *)0x0);
    SSL_CTX_ctrl((SSL_CTX *)ssl_ctx,0x2c,0,(void *)0x0);
    local_c = 0;
  }
  return local_c;
}

Assistant:

static int ssl_init(void)
{
	/* Load encryption & hashing algorithms for the SSL program */
	SSL_library_init();

	/* Load the error strings for SSL & CRYPTO APIs */
	SSL_load_error_strings();

	// SSL context for the process. All connections will share one
	// process level context.
	ssl_ctx = SSL_CTX_new(TLS_client_method());
	if (!ssl_ctx)
		return -1;

	SSL_CTX_set_min_proto_version(ssl_ctx, TLS1_2_VERSION);

	/* Don't verify the certificate */
	SSL_CTX_set_verify(ssl_ctx, SSL_VERIFY_NONE, NULL);

	/* Don't use session caching */
	SSL_CTX_set_session_cache_mode(ssl_ctx, SSL_SESS_CACHE_OFF);

	return 0;
}